

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceManager.cpp
# Opt level: O2

SourceLocation __thiscall
slang::SourceManager::getOriginalLoc(SourceManager *this,SourceLocation location)

{
  pointer pvVar1;
  variant_alternative_t<1UL,_variant<FileInfo,_ExpansionInfo>_> *pvVar2;
  SourceLocation SVar3;
  ulong uVar4;
  shared_lock<std::shared_mutex> lock;
  
  uVar4 = (ulong)location & 0xfffffff;
  if (uVar4 == 0) {
    SVar3 = (SourceLocation)0x0;
  }
  else {
    lock._M_owns = true;
    lock._M_pm = &this->mut;
    std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)this);
    pvVar1 = (this->bufferEntries).
             super__Vector_base<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>,_std::allocator<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->bufferEntries).
                       super__Vector_base<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>,_std::allocator<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1) / 0x38) <= uVar4)
    {
      assert::assertFailed
                ("buffer.getId() < bufferEntries.size()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/text/SourceManager.cpp"
                 ,0xf4,"SourceLocation slang::SourceManager::getOriginalLoc(SourceLocation) const");
    }
    pvVar2 = std::get<1ul,slang::SourceManager::FileInfo,slang::SourceManager::ExpansionInfo>
                       (pvVar1 + uVar4);
    SVar3 = (SourceLocation)(((ulong)location & 0xfffffffff0000000) + (long)pvVar2->originalLoc);
    std::shared_lock<std::shared_mutex>::~shared_lock(&lock);
  }
  return SVar3;
}

Assistant:

void SourceManager::addUserDirectory(string_view path) {
    std::unique_lock lock(mut);
    userDirectories.push_back(fs::canonical(widen(path)));
}